

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O2

int ddJumpingAux(DdManager *table,int x,int x_low,int x_high,double temp)

{
  int iVar1;
  int iVar2;
  DdHalfWord DVar3;
  DdHalfWord DVar4;
  DdNode *pDVar5;
  int size;
  DdNode *pDVar6;
  DdHalfWord local_44;
  int local_40;
  
  size = table->keys - table->isolated;
  iVar1 = cuddNextLow(table,x);
  iVar2 = cuddNextHigh(table,x);
  if (iVar1 < x_low) {
    if (x_high < iVar2) {
      return 1;
    }
    DVar3 = cuddNextHigh(table,x);
    pDVar6 = (DdNode *)0x0;
    local_44 = x;
    local_40 = size;
    while (DVar4 = DVar3, (int)DVar4 <= x_high) {
      iVar1 = cuddSwapInPlace(table,local_44,DVar4);
      if ((iVar1 == 0) || (pDVar5 = cuddDynamicAllocNode(table), pDVar5 == (DdNode *)0x0))
      goto LAB_00756243;
      pDVar5->index = local_44;
      pDVar5->ref = DVar4;
      *(int *)((long)&pDVar5->next + 4) = iVar1;
      (pDVar5->type).kids.T = pDVar6;
      if ((double)local_40 * table->maxGrowth < (double)iVar1) goto LAB_00756335;
      if (iVar1 < local_40) {
        local_40 = iVar1;
      }
      DVar3 = cuddNextHigh(table,DVar4);
      pDVar6 = pDVar5;
      local_44 = DVar4;
    }
  }
  else {
    if (iVar2 <= x_high) {
      fwrite("Unexpected condition in ddJumping\n",0x22,1,(FILE *)table->err);
      goto LAB_00756326;
    }
    DVar3 = cuddNextLow(table,x);
    pDVar6 = (DdNode *)0x0;
    local_44 = size;
    while (x_low <= (int)DVar3) {
      iVar1 = cuddSwapInPlace(table,DVar3,x);
      if ((iVar1 == 0) || (pDVar5 = cuddDynamicAllocNode(table), pDVar5 == (DdNode *)0x0))
      goto LAB_00756306;
      pDVar5->index = DVar3;
      pDVar5->ref = x;
      *(int *)((long)&pDVar5->next + 4) = iVar1;
      (pDVar5->type).kids.T = pDVar6;
      if ((double)(int)local_44 * table->maxGrowth < (double)iVar1) goto LAB_00756335;
      if (iVar1 < (int)local_44) {
        local_44 = iVar1;
      }
      DVar4 = cuddNextLow(table,DVar3);
      pDVar6 = pDVar5;
      x = DVar3;
      DVar3 = DVar4;
    }
  }
  pDVar5 = pDVar6;
  if (pDVar6 != (DdNode *)0x0) {
LAB_00756335:
    iVar1 = siftBackwardProb(table,(Move *)pDVar5,size,temp);
    if (iVar1 != 0) {
      while (pDVar5 != (DdNode *)0x0) {
        pDVar6 = (pDVar5->type).kids.T;
        pDVar5->ref = 0;
        pDVar5->next = table->nextFree;
        table->nextFree = pDVar5;
        pDVar5 = pDVar6;
      }
      return 1;
    }
    goto LAB_0075636e;
  }
  goto LAB_00756326;
LAB_00756306:
  while (pDVar6 != (DdNode *)0x0) {
    pDVar5 = (pDVar6->type).kids.T;
    pDVar6->ref = 0;
    pDVar6->next = table->nextFree;
    table->nextFree = pDVar6;
    pDVar6 = pDVar5;
  }
  goto LAB_00756326;
LAB_00756243:
  while (pDVar6 != (DdNode *)0x0) {
    pDVar5 = (pDVar6->type).kids.T;
    pDVar6->ref = 0;
    pDVar6->next = table->nextFree;
    table->nextFree = pDVar6;
    pDVar6 = pDVar5;
  }
LAB_00756326:
  pDVar5 = (DdNode *)0x0;
LAB_0075636e:
  while (pDVar5 != (DdNode *)0x0) {
    pDVar6 = (pDVar5->type).kids.T;
    pDVar5->ref = 0;
    pDVar5->next = table->nextFree;
    table->nextFree = pDVar5;
    pDVar5 = pDVar6;
  }
  return 0;
}

Assistant:

static int
ddJumpingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high,
  double  temp)
{
    Move       *move;
    Move       *moves;        /* list of moves */
    int        initial_size;
    int        result;

    initial_size = table->keys - table->isolated;

#ifdef DD_DEBUG
    assert(table->subtables[x].keys > 0);
#endif

    moves = NULL;

    if (cuddNextLow(table,x) < x_low) {
        if (cuddNextHigh(table,x) > x_high) return(1);
        moves = ddJumpingDown(table,x,x_high,initial_size);
        /* after that point x --> x_high unless early termination */
        if (moves == NULL) goto ddJumpingAuxOutOfMem;
        /* move backward and stop at best position or accept uphill move */
        result = siftBackwardProb(table,moves,initial_size,temp);
        if (!result) goto ddJumpingAuxOutOfMem;
    } else if (cuddNextHigh(table,x) > x_high) {
        moves = ddJumpingUp(table,x,x_low,initial_size);
        /* after that point x --> x_low unless early termination */
        if (moves == NULL) goto ddJumpingAuxOutOfMem;
        /* move backward and stop at best position or accept uphill move */
        result = siftBackwardProb(table,moves,initial_size,temp);
        if (!result) goto ddJumpingAuxOutOfMem;
    } else {
        (void) fprintf(table->err,"Unexpected condition in ddJumping\n");
        goto ddJumpingAuxOutOfMem;
    }
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(1);

ddJumpingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}